

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O2

uint64_t helper_iwmmxt_sadb_arm(uint64_t a,uint64_t b)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  undefined1 auVar7 [12];
  byte bVar9;
  ushort uVar8;
  byte bVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  bVar9 = (byte)(a >> 8);
  bVar10 = (byte)(b >> 8);
  uVar4 = (ushort)(a >> 0x18);
  uVar3 = (ushort)(a >> 0x28);
  uVar1 = (ushort)(a >> 0x30);
  uVar19 = (ushort)a & 0xff;
  uVar16 = CONCAT44(CONCAT22(uVar1,uVar3),(int)(a >> 0x10)) & 0xff00ff00ff00ff;
  uVar20 = (ushort)(byte)(a >> 0x38);
  uVar8 = (ushort)b & 0xff;
  uVar6 = (ushort)(b >> 0x18);
  uVar5 = (ushort)(b >> 0x28);
  uVar2 = (ushort)(b >> 0x30);
  uVar11 = CONCAT44(CONCAT22(uVar2,uVar5),(int)(b >> 0x10)) & 0xff00ff00ff00ff;
  uVar21 = (ushort)(byte)(b >> 0x38);
  auVar17._0_2_ = (uVar4 & 0xff) - (uVar6 & 0xff);
  auVar17._2_2_ = uVar19 - uVar8;
  auVar17._4_2_ = uVar20 - uVar21;
  auVar17._6_2_ = (ushort)bVar9 - (ushort)bVar10;
  auVar17._8_2_ = ((ushort)(a >> 0x10) & 0xff) - ((ushort)(b >> 0x10) & 0xff);
  auVar17._10_2_ = ((ushort)(a >> 0x20) & 0xff) - ((ushort)(b >> 0x20) & 0xff);
  auVar17._12_2_ = (uVar3 & 0xff) - (uVar5 & 0xff);
  auVar17._14_2_ = (uVar1 & 0xff) - (uVar2 & 0xff);
  auVar18._2_2_ = -(uVar19 + uVar8);
  auVar18._0_2_ = -((uVar6 & 0xff) + (uVar4 & 0xff));
  auVar18._4_2_ = -(uVar21 + uVar20);
  auVar18._6_2_ = -((ushort)bVar10 + (ushort)bVar9);
  auVar18._8_2_ = -((short)uVar11 + (short)uVar16);
  auVar18._10_2_ = -((short)(uVar11 >> 0x10) + (short)(uVar16 >> 0x10));
  auVar18._12_2_ = -((short)(uVar11 >> 0x20) + (short)(uVar16 >> 0x20));
  auVar18._14_2_ = -((short)(uVar11 >> 0x30) + (short)(uVar16 >> 0x30));
  auVar12._0_2_ = -(ushort)(auVar17._0_2_ < 0);
  auVar12._2_2_ = -(ushort)(auVar17._2_2_ < 0);
  auVar12._4_2_ = -(ushort)(auVar17._4_2_ < 0);
  auVar12._6_2_ = -(ushort)(auVar17._6_2_ < 0);
  auVar12._8_2_ = -(ushort)(auVar17._8_2_ < 0);
  auVar12._10_2_ = -(ushort)(auVar17._10_2_ < 0);
  auVar12._12_2_ = -(ushort)(auVar17._12_2_ < 0);
  auVar12._14_2_ = -(ushort)(auVar17._14_2_ < 0);
  auVar12 = ~auVar12 & auVar17 | auVar18 & auVar12;
  auVar15._0_12_ = auVar12._0_12_;
  auVar15._12_2_ = auVar12._6_2_;
  auVar15._14_2_ = auVar12._6_2_;
  auVar14._12_4_ = auVar15._12_4_;
  auVar14._0_10_ = auVar12._0_10_;
  auVar14._10_2_ = auVar12._4_2_;
  auVar13._10_6_ = auVar14._10_6_;
  auVar13._0_8_ = auVar12._0_8_;
  auVar13._8_2_ = auVar12._4_2_;
  auVar7._4_8_ = auVar13._8_8_;
  auVar7._2_2_ = auVar12._2_2_;
  auVar7._0_2_ = auVar12._2_2_;
  return (long)((auVar14._12_4_ >> 0x10) + (int)auVar12._14_2_ +
                (auVar7._0_4_ >> 0x10) + (int)auVar12._10_2_ +
               (auVar13._8_4_ >> 0x10) + (int)auVar12._12_2_ +
               (int)auVar12._0_2_ + (int)auVar12._8_2_);
}

Assistant:

uint64_t HELPER(iwmmxt_sadb)(uint64_t a, uint64_t b)
{
#define abs(x) (((x) >= 0) ? x : -x)
#define SADB(SHR) abs((int) ((a >> SHR) & 0xff) - (int) ((b >> SHR) & 0xff))
    return
        SADB(0) + SADB(8) + SADB(16) + SADB(24) +
        SADB(32) + SADB(40) + SADB(48) + SADB(56);
#undef SADB
}